

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O1

void __thiscall
cnn::LookupParameters::load<boost::archive::text_iarchive>
          (LookupParameters *this,text_iarchive *ar,uint param_2)

{
  long lVar1;
  pointer pTVar2;
  ulong uVar3;
  ulong uVar4;
  void *x;
  bool bVar5;
  int nv;
  int local_2c;
  
  boost::serialization::
  singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Dim>_>::
  get_instance();
  boost::archive::detail::basic_iarchive::load_object(ar,(basic_iserializer *)&this->dim);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_2c);
  if (local_2c ==
      (int)((ulong)((long)(this->values).
                          super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->values).
                         super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
    pTVar2 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar2) {
      uVar3 = 0;
      uVar4 = 1;
      do {
        boost::serialization::
        singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Tensor>_>
        ::get_instance();
        boost::archive::detail::basic_iarchive::load_object
                  (ar,(basic_iserializer *)(pTVar2 + uVar3));
        pTVar2 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar3 = ((long)(this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
                -0x71c71c71c71c71c7;
        bVar5 = uVar4 <= uVar3;
        lVar1 = uVar3 - uVar4;
        uVar3 = uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar5 && lVar1 != 0);
    }
    return;
  }
  __assert_fail("nv == (int)values.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                ,0x5c,
                "void cnn::LookupParameters::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
               );
}

Assistant:

void load(Archive& ar, const unsigned int) {
    ar & dim;
    int nv;
    ar & nv;
    assert(nv == (int)values.size());
    for (unsigned i = 0; i < values.size(); ++i)
      ar & values[i];
  }